

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::EmitAddtlInfo_SnapPromiseInfo(SnapObject *snpObject,FileWriter *writer)

{
  uint32 *puVar1;
  ulong uVar2;
  long lVar3;
  
  if (snpObject->SnapObjectTag == SnapPromiseObject) {
    puVar1 = (uint32 *)snpObject->AddtlSnapObjectInfo;
    FileWriter::WriteUInt32(writer,u32Val,*puVar1,CommaSeparator);
    (*writer->_vptr_FileWriter[0xc])(writer,10,(ulong)(byte)puVar1[1],1);
    (*writer->_vptr_FileWriter[3])(writer,6,1);
    NSSnapValues::EmitTTDVar(*(TTDVar *)(puVar1 + 2),writer,NoSeparator);
    FileWriter::WriteLengthValue(writer,puVar1[4],CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if (puVar1[4] != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        NSSnapValues::EmitPromiseReactionInfo
                  ((SnapPromiseReactionInfo *)(*(long *)(puVar1 + 6) + lVar3),writer,lVar3 != 0);
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar2 < puVar1[4]);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    FileWriter::WriteLengthValue(writer,puVar1[8],CommaSeparator);
    FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
    if (puVar1[8] != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        NSSnapValues::EmitPromiseReactionInfo
                  ((SnapPromiseReactionInfo *)(*(long *)(puVar1 + 10) + lVar3),writer,lVar3 != 0);
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x30;
      } while (uVar2 < puVar1[8]);
    }
    (*writer->_vptr_FileWriter[5])(writer,0);
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void EmitAddtlInfo_SnapPromiseInfo(const SnapObject* snpObject, FileWriter* writer)
        {
            SnapPromiseInfo* promiseInfo = SnapObjectGetAddtlInfoAs<SnapPromiseInfo*, SnapObjectType::SnapPromiseObject>(snpObject);

            writer->WriteUInt32(NSTokens::Key::u32Val, promiseInfo->Status, NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::boolVal, promiseInfo->isHandled, NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::resultValue, NSTokens::Separator::CommaSeparator);
            NSSnapValues::EmitTTDVar(promiseInfo->Result, writer, NSTokens::Separator::NoSeparator);

            writer->WriteLengthValue(promiseInfo->ResolveReactionCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < promiseInfo->ResolveReactionCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                NSSnapValues::EmitPromiseReactionInfo(promiseInfo->ResolveReactions + i, writer, sep);
            }
            writer->WriteSequenceEnd();

            writer->WriteLengthValue(promiseInfo->RejectReactionCount, NSTokens::Separator::CommaSeparator);
            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);
            for(uint32 i = 0; i < promiseInfo->RejectReactionCount; ++i)
            {
                NSTokens::Separator sep = (i != 0) ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator;
                NSSnapValues::EmitPromiseReactionInfo(promiseInfo->RejectReactions + i, writer, sep);
            }
            writer->WriteSequenceEnd();
        }